

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

ErrorCode duckdb_re2::RegexpErrorToRE2(RegexpStatusCode code)

{
  RegexpStatusCode code_local;
  ErrorCode local_4;
  
  switch(code) {
  case kRegexpSuccess:
    local_4 = NoError;
    break;
  case kRegexpInternalError:
    local_4 = ErrorInternal;
    break;
  case kRegexpBadEscape:
    local_4 = ErrorBadEscape;
    break;
  case kRegexpBadCharClass:
    local_4 = ErrorBadCharClass;
    break;
  case kRegexpBadCharRange:
    local_4 = ErrorBadCharRange;
    break;
  case kRegexpMissingBracket:
    local_4 = ErrorMissingBracket;
    break;
  case kRegexpMissingParen:
    local_4 = ErrorMissingParen;
    break;
  case kRegexpUnexpectedParen:
    local_4 = ErrorUnexpectedParen;
    break;
  case kRegexpTrailingBackslash:
    local_4 = ErrorTrailingBackslash;
    break;
  case kRegexpRepeatArgument:
    local_4 = ErrorRepeatArgument;
    break;
  case kRegexpRepeatSize:
    local_4 = ErrorRepeatSize;
    break;
  case kRegexpRepeatOp:
    local_4 = ErrorRepeatOp;
    break;
  case kRegexpBadPerlOp:
    local_4 = ErrorBadPerlOp;
    break;
  case kRegexpBadUTF8:
    local_4 = ErrorBadUTF8;
    break;
  case kRegexpBadNamedCapture:
    local_4 = ErrorBadNamedCapture;
    break;
  default:
    local_4 = ErrorInternal;
  }
  return local_4;
}

Assistant:

static RE2::ErrorCode RegexpErrorToRE2(duckdb_re2::RegexpStatusCode code) {
  switch (code) {
    case duckdb_re2::kRegexpSuccess:
      return RE2::NoError;
    case duckdb_re2::kRegexpInternalError:
      return RE2::ErrorInternal;
    case duckdb_re2::kRegexpBadEscape:
      return RE2::ErrorBadEscape;
    case duckdb_re2::kRegexpBadCharClass:
      return RE2::ErrorBadCharClass;
    case duckdb_re2::kRegexpBadCharRange:
      return RE2::ErrorBadCharRange;
    case duckdb_re2::kRegexpMissingBracket:
      return RE2::ErrorMissingBracket;
    case duckdb_re2::kRegexpMissingParen:
      return RE2::ErrorMissingParen;
    case duckdb_re2::kRegexpUnexpectedParen:
      return RE2::ErrorUnexpectedParen;
    case duckdb_re2::kRegexpTrailingBackslash:
      return RE2::ErrorTrailingBackslash;
    case duckdb_re2::kRegexpRepeatArgument:
      return RE2::ErrorRepeatArgument;
    case duckdb_re2::kRegexpRepeatSize:
      return RE2::ErrorRepeatSize;
    case duckdb_re2::kRegexpRepeatOp:
      return RE2::ErrorRepeatOp;
    case duckdb_re2::kRegexpBadPerlOp:
      return RE2::ErrorBadPerlOp;
    case duckdb_re2::kRegexpBadUTF8:
      return RE2::ErrorBadUTF8;
    case duckdb_re2::kRegexpBadNamedCapture:
      return RE2::ErrorBadNamedCapture;
  }
  return RE2::ErrorInternal;
}